

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t FilterLookupSet(nodemeta *m)

{
  byte local_13;
  byte local_12;
  byte local_11;
  nodemeta *m_local;
  
  local_11 = 1;
  if ((((undefined1  [16])*m & (undefined1  [16])0xff) != (undefined1  [16])0x29) &&
     (local_11 = 1, ((undefined1  [16])*m & (undefined1  [16])0xff) != (undefined1  [16])0x2d)) {
    local_12 = 0;
    if (((undefined1  [16])*m & (undefined1  [16])0xc0) == (undefined1  [16])0x40) {
      local_13 = 1;
      if (((undefined1  [16])m[1] & (undefined1  [16])0xff) == (undefined1  [16])0x2) {
        local_13 = (m[1].Data & 1) != 0 ^ 0xff;
      }
      local_12 = local_13;
    }
    local_11 = local_12;
  }
  return (long)(int)(uint)(local_11 & 1);
}

Assistant:

static bool_t FilterLookupSet(const nodemeta* m)
{
    return m->Meta==META_PARAM_SET || m->Meta==META_PARAM_EVENT ||
#if defined(CONFIG_CORECDOC)
        ((m->Meta & META_MODE_MASK)==META_MODE_DATA && (m[2].Meta != META_PARAM_DATA_FLAGS || !((int)m[2].Data & DFLAG_RDONLY)));
#else
        ((m->Meta & META_MODE_MASK)==META_MODE_DATA && (m[1].Meta != META_PARAM_DATA_FLAGS || !((int)m[1].Data & DFLAG_RDONLY)));
#endif
}